

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O3

bool __thiscall ON_PolylineCurve::Reverse(ON_PolylineCurve *this)

{
  double dVar1;
  double *pdVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  uVar4 = ON_Polyline::PointCount(&this->m_pline);
  if (1 < (int)uVar4) {
    ON_SimpleArray<ON_3dPoint>::Reverse((ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
    lVar5 = (long)(this->m_t).m_count;
    pdVar2 = (this->m_t).m_a;
    if (1 < lVar5) {
      lVar6 = 0;
      lVar5 = lVar5 + -2;
      do {
        dVar1 = pdVar2[lVar6];
        pdVar2[lVar6] = pdVar2[lVar5 + 1];
        pdVar2[lVar5 + 1] = dVar1;
        lVar6 = lVar6 + 1;
        bVar3 = lVar6 < lVar5;
        lVar5 = lVar5 + -1;
      } while (bVar3);
    }
    uVar7 = 0;
    do {
      pdVar2[uVar7] = -pdVar2[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return 1 < (int)uVar4;
}

Assistant:

bool
ON_PolylineCurve::Reverse()
{
  bool rc = false;
  const int count = PointCount();
  if ( count >= 2 ) {
    m_pline.Reverse();
    m_t.Reverse();
    double* t = m_t.Array();
    for ( int i = 0; i < count; i++ ) {
      t[i] = -t[i];
    }
    rc = true;
  }
	DestroyCurveTree();
  return rc;
}